

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::LambdaRefExpression::Deserialize(LambdaRefExpression *this,Deserializer *deserializer)

{
  unsigned_long lambda_idx;
  LambdaRefExpression *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_name;
  string local_38;
  
  lambda_idx = Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,200,"lambda_idx");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (&column_name,deserializer,0xc9,"column_name");
  this_00 = (LambdaRefExpression *)operator_new(0x60);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)column_name._M_dataplus._M_p == &column_name.field_2) {
    local_38.field_2._8_8_ = column_name.field_2._8_8_;
  }
  else {
    local_38._M_dataplus._M_p = column_name._M_dataplus._M_p;
  }
  local_38._M_string_length = column_name._M_string_length;
  column_name._M_string_length = 0;
  column_name.field_2._M_local_buf[0] = '\0';
  column_name._M_dataplus._M_p = (pointer)&column_name.field_2;
  LambdaRefExpression(this_00,lambda_idx,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  ::std::__cxx11::string::~string((string *)&column_name);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> LambdaRefExpression::Deserialize(Deserializer &deserializer) {
	auto lambda_idx = deserializer.ReadPropertyWithDefault<idx_t>(200, "lambda_idx");
	auto column_name = deserializer.ReadPropertyWithDefault<string>(201, "column_name");
	auto result = duckdb::unique_ptr<LambdaRefExpression>(new LambdaRefExpression(lambda_idx, std::move(column_name)));
	return std::move(result);
}